

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,double f)

{
  QLocale *other;
  RealNumberNotation RVar1;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> QVar2;
  QTextStreamPrivate *this_00;
  QTextStreamPrivate *pQVar3;
  QLocalePrivate *pQVar4;
  uint uVar5;
  bool bVar6;
  NumberOptions NVar7;
  uint uVar8;
  DoubleForm form;
  QTextStreamPrivate *d;
  long in_FS_OFFSET;
  QString local_58;
  QLocale local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t
            .super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
            super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    operator<<(this);
  }
  else {
    RVar1 = (this_00->params).realNumberNotation;
    form = DFSignificantDigits;
    if (RVar1 != SmartNotation) {
      form = (uint)(RVar1 != ScientificNotation);
    }
    other = &this_00->locale;
    QLocale::QLocale((QLocale *)&local_58,other);
    NVar7 = QLocale::numberOptions((QLocale *)&local_58);
    QLocale::~QLocale((QLocale *)&local_58);
    pQVar3 = (this->d_ptr)._M_t.
             super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
             _M_t.
             super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
             super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
    QVar2.super_QFlagsStorage<QTextStream::NumberFlag>.i =
         (pQVar3->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
         super_QFlagsStorage<QTextStream::NumberFlag>;
    QLocale::QLocale((QLocale *)&local_58,&pQVar3->locale);
    QLocale::QLocale(&local_40,C,AnyScript,AnyCountry);
    uVar8 = (int)QVar2.super_QFlagsStorage<QTextStream::NumberFlag>.i * 4 & 0x40U |
            ((uint)QVar2.super_QFlagsStorage<QTextStream::NumberFlag>.i & 8) << 5 |
            (int)QVar2.super_QFlagsStorage<QTextStream::NumberFlag>.i * 4 & 0x10U |
            ((uint)QVar2.super_QFlagsStorage<QTextStream::NumberFlag>.i & 1) << 7;
    uVar5 = uVar8 | 0x481;
    if (((uint)QVar2.super_QFlagsStorage<QTextStream::NumberFlag>.i & 2) == 0) {
      uVar5 = uVar8;
    }
    bVar6 = QLocale::equals((QLocale *)&local_58,&local_40);
    QLocale::~QLocale(&local_40);
    QLocale::~QLocale((QLocale *)&local_58);
    uVar8 = (((uint)NVar7.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                    super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5 | uVar5) ^ 0x20;
    if (bVar6) {
      uVar8 = uVar5;
    }
    pQVar4 = (other->d).d.ptr;
    if ((pQVar4 != (QLocalePrivate *)0x0) &&
       ((pQVar4->ref)._q_value.super___atomic_base<int>._M_i != 1)) {
      QSharedDataPointer<QLocalePrivate>::detach_helper(&other->d);
    }
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QLocaleData::doubleToString
              (&local_58,((this_00->locale).d.d.ptr)->m_data,f,(this_00->params).realNumberPrecision
               ,form,-1,((uint)NVar7.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                               super_QFlagsStorage<QLocale::NumberOption>.i >> 4 & 1 |
                        ((uint)NVar7.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                               super_QFlagsStorage<QLocale::NumberOption>.i & 4) << 7) ^ 0x200 |
                        uVar8);
    QTextStreamPrivate::putString(this_00,(QChar *)local_58.d.ptr,local_58.d.size,true);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(double f)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);

    QLocaleData::DoubleForm form = QLocaleData::DFDecimal;
    switch (realNumberNotation()) {
    case FixedNotation:
        form = QLocaleData::DFDecimal;
        break;
    case ScientificNotation:
        form = QLocaleData::DFExponent;
        break;
    case SmartNotation:
        form = QLocaleData::DFSignificantDigits;
        break;
    }

    uint flags = 0;
    const QLocale::NumberOptions numberOptions = locale().numberOptions();
    if (numberFlags() & ShowBase)
        flags |= QLocaleData::ShowBase;
    if (numberFlags() & ForceSign)
        flags |= QLocaleData::AlwaysShowSign;
    if (numberFlags() & UppercaseBase)
        flags |= QLocaleData::UppercaseBase;
    if (numberFlags() & UppercaseDigits)
        flags |= QLocaleData::CapitalEorX;
    if (numberFlags() & ForcePoint) {
        flags |= QLocaleData::ForcePoint;

        // Only for backwards compatibility
        flags |= QLocaleData::AddTrailingZeroes | QLocaleData::ShowBase;
    }
    if (locale() != QLocale::c() && !(numberOptions & QLocale::OmitGroupSeparator))
        flags |= QLocaleData::GroupDigits;
    if (!(numberOptions & QLocale::OmitLeadingZeroInExponent))
        flags |= QLocaleData::ZeroPadExponent;
    if (numberOptions & QLocale::IncludeTrailingZeroesAfterDot)
        flags |= QLocaleData::AddTrailingZeroes;

    const QLocaleData *dd = d->locale.d->m_data;
    QString num = dd->doubleToString(f, d->params.realNumberPrecision, form, -1, flags);
    d->putString(num, true);
    return *this;
}